

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::ZNames::ZNamesLoader::setNameIfEmpty
          (ZNamesLoader *this,char *key,ResourceValue *value,UErrorCode *errorCode)

{
  UChar *local_40;
  undefined1 local_30 [4];
  UTimeZoneNameTypeIndex local_2c;
  int32_t length;
  UTimeZoneNameTypeIndex type;
  UErrorCode *errorCode_local;
  ResourceValue *value_local;
  char *key_local;
  ZNamesLoader *this_local;
  
  _length = errorCode;
  errorCode_local = (UErrorCode *)value;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  local_2c = nameTypeFromKey(key);
  if ((local_2c != UTZNM_INDEX_UNKNOWN) && (this->names[local_2c] == (UChar *)0x0)) {
    if (errorCode_local == (UErrorCode *)0x0) {
      local_40 = L"";
    }
    else {
      local_40 = (UChar *)(**(code **)(*(undefined8 *)errorCode_local + 0x20))
                                    (errorCode_local,local_30,_length);
    }
    this->names[local_2c] = local_40;
  }
  return;
}

Assistant:

void setNameIfEmpty(const char* key, const ResourceValue* value, UErrorCode& errorCode) {
        UTimeZoneNameTypeIndex type = nameTypeFromKey(key);
        if (type == UTZNM_INDEX_UNKNOWN) { return; }
        if (names[type] == NULL) {
            int32_t length;
            // 'NO_NAME' indicates internally that this field should remain empty.  It will be
            // replaced by 'NULL' in getNames()
            names[type] = (value == NULL) ? NO_NAME : value->getString(length, errorCode);
        }
    }